

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_error_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  uint32_t *this;
  bool bVar1;
  global_object *pgVar2;
  gc_heap *pgVar3;
  gc_heap *pgVar4;
  char *pcVar5;
  gc_heap_ptr<mjs::gc_string> *name;
  function_object *pfVar6;
  object *poVar7;
  wstring_view wVar8;
  anon_class_16_1_570cf4e1_for_f local_280;
  gc_heap_ptr<mjs::object> local_270;
  value local_260;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_238;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  string local_208;
  value local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  string local_1c0;
  gc_heap_ptr<mjs::object> local_1b0;
  value local_1a0;
  string local_178;
  undefined1 local_168 [16];
  anon_class_56_4_02041cfa_for_f local_158;
  undefined1 local_120 [8];
  gc_heap_ptr<mjs::function_object> constructor;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  string local_f8;
  undefined1 local_e8 [24];
  object_ptr prototype;
  string n;
  native_error_type error_type;
  native_error_type *__end1;
  native_error_type *__begin1;
  native_error_type (*__range1) [8];
  gc_heap_ptr<mjs::function_object> error_constructor;
  string local_78;
  string local_68;
  string local_58;
  undefined1 local_48 [24];
  object_ptr error_prototype;
  string err_str;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0x13])
            (&error_prototype.super_gc_heap_ptr_untyped.pos_,pgVar2,"Error");
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  pgVar3 = object::heap(&pgVar2->super_object);
  local_58.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_._0_4_ = 0;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0xb])(&local_68);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  pgVar4 = object::heap(&pgVar2->super_object);
  this = &error_constructor.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,"");
  string::string(&local_78,pgVar4,(string_view *)this);
  gc_heap::
  make<mjs::error_object,mjs::native_error_type,mjs::string&,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)local_48,(native_error_type *)pgVar3,&local_58,
             (gc_heap_ptr<mjs::object> *)&error_prototype.super_gc_heap_ptr_untyped.pos_,&local_68);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::error_object,void>
            ((gc_heap_ptr<mjs::object> *)(local_48 + 0x10),
             (gc_heap_ptr<mjs::error_object> *)local_48);
  gc_heap_ptr<mjs::error_object>::~gc_heap_ptr((gc_heap_ptr<mjs::error_object> *)local_48);
  string::~string(&local_78);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&local_68);
  gc_heap_ptr<mjs::function_object>::gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)&__range1);
  __end1 = &native_error_types;
  do {
    if (__end1 == (native_error_type *)
                  "N3mjs11gc_function4implIZNS_17make_error_objectERKNS_11gc_heap_ptrINS_13global_objectEEEE3$_0EE"
       ) {
      gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_280.global,global);
      put_native_function<mjs::make_error_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
                (global,(object_ptr *)(local_48 + 0x10),"toString",&local_280,0);
      make_error_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_1::~__1((__1 *)&local_280);
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
                (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)&__range1);
      gc_heap_ptr<mjs::object>::gc_heap_ptr(&__return_storage_ptr__->prototype,(nullptr_t)0x0);
      gc_heap_ptr<mjs::function_object>::~gc_heap_ptr
                ((gc_heap_ptr<mjs::function_object> *)&__range1);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_48 + 0x10));
      string::~string((string *)&error_prototype.super_gc_heap_ptr_untyped.pos_);
      return __return_storage_ptr__;
    }
    n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ = *__end1;
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
    pcVar5 = type_string(n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_);
    (*(pgVar2->super_object)._vptr_object[0x13])
              (&prototype.super_gc_heap_ptr_untyped.pos_,pgVar2,pcVar5);
    constructor.super_gc_heap_ptr_untyped._15_1_ = 0;
    constructor.super_gc_heap_ptr_untyped._14_1_ = 0;
    if (n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ == 0) {
      gc_heap_ptr<mjs::object>::gc_heap_ptr
                ((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10),
                 (gc_heap_ptr<mjs::object> *)(local_48 + 0x10));
    }
    else {
      pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
      pgVar3 = object::heap(&pgVar2->super_object);
      pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
      pgVar4 = object::heap(&pgVar2->super_object);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"");
      string::string(&local_f8,pgVar4,&local_108);
      constructor.super_gc_heap_ptr_untyped._15_1_ = 1;
      gc_heap::
      make<mjs::error_object,mjs::native_error_type_const&,mjs::string&,mjs::gc_heap_ptr<mjs::object>&,mjs::string>
                ((gc_heap *)local_e8,(native_error_type *)pgVar3,
                 (string *)&n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.field_0xc,
                 (gc_heap_ptr<mjs::object> *)&prototype.super_gc_heap_ptr_untyped.pos_,
                 (string *)(local_48 + 0x10));
      constructor.super_gc_heap_ptr_untyped._14_1_ = 1;
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::error_object,void>
                ((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10),
                 (gc_heap_ptr<mjs::error_object> *)local_e8);
    }
    if ((constructor.super_gc_heap_ptr_untyped._14_1_ & 1) != 0) {
      gc_heap_ptr<mjs::error_object>::~gc_heap_ptr((gc_heap_ptr<mjs::error_object> *)local_e8);
    }
    if ((constructor.super_gc_heap_ptr_untyped._15_1_ & 1) != 0) {
      string::~string(&local_f8);
    }
    local_158.error_type = n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_;
    string::string(&local_158.n,(string *)&prototype.super_gc_heap_ptr_untyped.pos_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr
              (&local_158.prototype,(gc_heap_ptr<mjs::object> *)(local_e8 + 0x10));
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_158.global,global);
    gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10));
    object::class_name((object *)local_168);
    name = string::unsafe_raw_get((string *)local_168);
    make_function<mjs::make_error_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
              ((mjs *)local_120,global,(anon_class_56_4_02041cfa_for_f *)(local_168 + 0x10),name,1);
    string::~string((string *)local_168);
    make_error_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0
              ((__0 *)(local_168 + 0x10));
    pfVar6 = gc_heap_ptr<mjs::function_object>::operator->
                       ((gc_heap_ptr<mjs::function_object> *)local_120);
    function_object::default_construct_function(pfVar6);
    pfVar6 = gc_heap_ptr<mjs::function_object>::operator->
                       ((gc_heap_ptr<mjs::function_object> *)local_120);
    function_object::put_prototype_with_attributes
              (pfVar6,(object_ptr *)(local_e8 + 0x10),dont_delete|dont_enum|read_only);
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10));
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
    (*(pgVar2->super_object)._vptr_object[0x13])(&local_178,pgVar2,"constructor");
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_1b0,(gc_heap_ptr<mjs::function_object> *)local_120);
    value::value(&local_1a0,&local_1b0);
    object::redefine_own_property(poVar7,&local_178,&local_1a0,dont_enum);
    value::~value(&local_1a0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1b0);
    string::~string(&local_178);
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10));
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
    pgVar3 = object::heap(&pgVar2->super_object);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"message");
    string::string(&local_1c0,pgVar3,&local_1d0);
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
    pgVar3 = object::heap(&pgVar2->super_object);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_218,"");
    string::string(&local_208,pgVar3,&local_218);
    value::value(&local_1f8,&local_208);
    (*poVar7->_vptr_object[1])(poVar7,&local_1c0,&local_1f8,6);
    value::~value(&local_1f8);
    string::~string(&local_208);
    string::~string(&local_1c0);
    bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)&__range1);
    if (bVar1) {
      pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
                (&local_270,(gc_heap_ptr<mjs::function_object> *)local_120);
      value::value(&local_260,&local_270);
      (*(pgVar2->super_object)._vptr_object[1])
                (pgVar2,&prototype.super_gc_heap_ptr_untyped.pos_,&local_260,2);
      value::~value(&local_260);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_270);
    }
    else {
      wVar8 = string::view((string *)&prototype.super_gc_heap_ptr_untyped.pos_);
      local_228 = wVar8;
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_238,L"Error");
      bVar1 = std::operator==(local_228,local_238);
      if (!bVar1) {
        __assert_fail("n.view() == L\"Error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp"
                      ,0x7c,
                      "global_object_create_result mjs::make_error_object(const gc_heap_ptr<global_object> &)"
                     );
      }
      gc_heap_ptr<mjs::function_object>::operator=
                ((gc_heap_ptr<mjs::function_object> *)&__range1,
                 (gc_heap_ptr<mjs::function_object> *)local_120);
    }
    gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_120);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_e8 + 0x10));
    string::~string((string *)&prototype.super_gc_heap_ptr_untyped.pos_);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

global_object_create_result make_error_object(const gc_heap_ptr<global_object>& global) {
    auto err_str = global->common_string("Error");

    object_ptr error_prototype = global->heap().make<error_object>(native_error_type::generic, err_str, global->object_prototype(), string{global->heap(), ""});

    gc_heap_ptr<function_object> error_constructor;
    for (const auto error_type: native_error_types) {
        auto n = global->common_string(type_string(error_type));
        auto prototype = error_type == native_error_type::generic ? error_prototype : global->heap().make<error_object>(error_type, n, error_prototype, string{global->heap(), ""});
        auto constructor = make_function(global, [error_type, n, prototype, global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto eo = h.make<error_object>(error_type, n, prototype, string{h, global->stack_trace()});
            if (!args.empty() && args.front().type() != value_type::undefined) {
                eo->put(global->common_string("message"), value{to_string(h, args.front())}, message_attributes);
            }
            return value{eo};
        }, prototype->class_name().unsafe_raw_get(), 1);
        constructor->default_construct_function();

        constructor->put_prototype_with_attributes(prototype, global_object::prototype_attributes);

        prototype->redefine_own_property(global->common_string("constructor"), value{constructor}, global_object::default_attributes);
        prototype->put(string{global->heap(), "message"}, value{string{global->heap(), ""}}, message_attributes);

        if (!error_constructor) {
            assert(n.view() == L"Error");
            error_constructor = constructor;
        } else {
            global->put(n, value{constructor}, property_attribute::dont_enum);
        }
    }

    put_native_function(global, error_prototype, "toString", [global](const value& this_, const std::vector<value>&) {
        if (this_.type() == value_type::object) {
            auto& o = this_.object_value();
            if (o.has_type<error_object>()) {
                return value{static_cast<const error_object&>(*o).to_string()};
            }
        }
        return value{global->common_string("Error")};
    }, 0);

    return { error_constructor, nullptr };
}